

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void recff_bit64_tobit(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  jit_State *J_00;
  jit_State *in_RSI;
  long in_RDI;
  TRef tr;
  CTState *cts;
  TValue *in_stack_ffffffffffffffa8;
  TRef in_stack_ffffffffffffffb4;
  
  J_00 = (jit_State *)(ulong)*(uint *)(in_RDI + -0xb4);
  TVar1 = crec_bit64_arg(in_RSI,(CType *)J_00,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  if (4 < (TVar1 >> 0x18 & 0x1f) - 0xf) {
    *(undefined2 *)(in_RDI + 0xa4) = 0x5913;
    *(short *)(in_RDI + 0xa0) = (short)TVar1;
    *(ushort *)(in_RDI + 0xa2) = (byte)(TVar1 >> 0x18) & 0x1f | 0x260;
    TVar1 = lj_opt_fold(J_00);
  }
  **(TRef **)(in_RDI + 0x88) = TVar1;
  return;
}

Assistant:

void LJ_FASTCALL recff_bit64_tobit(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  TRef tr = crec_bit64_arg(J, ctype_get(cts, CTID_INT64),
			   J->base[0], &rd->argv[0]);
  if (!tref_isinteger(tr))
    tr = emitconv(tr, IRT_INT, tref_type(tr), 0);
  J->base[0] = tr;
}